

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

ssize_t xar_write_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  la_int64_t lVar5;
  bool bVar6;
  size_t local_70;
  size_t off;
  size_t end;
  size_t i;
  uchar *b;
  xar_conflict *pxStack_48;
  int r;
  size_t rsize;
  size_t size;
  la_zaction run;
  xar_conflict *xar;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  rsize = 0;
  pvVar1 = a->format_data;
  xar = (xar_conflict *)s;
  if (*(ulong *)((long)pvVar1 + 0x48) < s) {
    xar = *(xar_conflict **)((long)pvVar1 + 0x48);
  }
  if ((xar == (xar_conflict *)0x0) || (*(long *)((long)pvVar1 + 0x40) == 0)) {
    a_local = (archive_write *)0x0;
  }
  else {
    if (*(int *)(*(long *)((long)pvVar1 + 0x40) + 0xf8) == 0) {
      checksum_update((chksumwork_conflict *)((long)pvVar1 + 0xb0),buff,(size_t)xar);
      checksum_update((chksumwork_conflict *)((long)pvVar1 + 0x98),buff,(size_t)xar);
      pxStack_48 = xar;
      rsize = (size_t)xar;
    }
    else {
      *(void **)((long)pvVar1 + 200) = buff;
      *(xar_conflict **)((long)pvVar1 + 0xd0) = xar;
      size._4_4_ = (la_zaction)(xar < *(xar_conflict **)((long)pvVar1 + 0x48));
      while( true ) {
        iVar4 = compression_code(&a->archive,(la_zstream_conflict *)((long)pvVar1 + 200),size._4_4_)
        ;
        if ((iVar4 != 0) && (iVar4 != 1)) {
          return -0x1e;
        }
        if ((*(long *)((long)pvVar1 + 0xe8) != 0) && (size._4_4_ != ARCHIVE_Z_FINISH)) break;
        rsize = 0x10000 - *(long *)((long)pvVar1 + 0xe8);
        checksum_update((chksumwork_conflict *)((long)pvVar1 + 0x98),(void *)((long)pvVar1 + 0x120),
                        rsize);
        *(size_t *)(*(long *)((long)pvVar1 + 0x40) + 0xe8) =
             rsize + *(long *)(*(long *)((long)pvVar1 + 0x40) + 0xe8);
        iVar3 = write_to_temp(a,(void *)((long)pvVar1 + 0x120),rsize);
        if (iVar3 != 0) {
          return -0x1e;
        }
        if (iVar4 != 0) break;
        *(long *)((long)pvVar1 + 0xe0) = (long)pvVar1 + 0x120;
        *(undefined8 *)((long)pvVar1 + 0xe8) = 0x10000;
      }
      pxStack_48 = (xar_conflict *)((long)xar - *(long *)((long)pvVar1 + 0xd0));
      checksum_update((chksumwork_conflict *)((long)pvVar1 + 0xb0),buff,(size_t)pxStack_48);
    }
    lVar2 = *(long *)((long)pvVar1 + 0x48);
    lVar5 = archive_entry_size(*(archive_entry **)(*(long *)((long)pvVar1 + 0x40) + 0x20));
    if ((((lVar2 == lVar5) &&
         (*(undefined8 *)(*(long *)((long)pvVar1 + 0x40) + 0x158) = 0,
         (xar_conflict *)0x2 < pxStack_48)) && (*buff == '#')) && (*(char *)((long)buff + 1) == '!')
       ) {
      local_70 = 2;
      if (*(char *)((long)buff + 2) == ' ') {
        local_70 = 3;
      }
      if ((long)pxStack_48 - local_70 < 0x1001) {
        off = (size_t)pxStack_48;
      }
      else {
        off = local_70 + 0x1000;
      }
      end = local_70;
      while( true ) {
        bVar6 = false;
        if (((end < off) && (bVar6 = false, *(char *)((long)buff + end) != '\0')) &&
           ((bVar6 = false, *(char *)((long)buff + end) != '\n' &&
            ((bVar6 = false, *(char *)((long)buff + end) != '\r' &&
             (bVar6 = false, *(char *)((long)buff + end) != ' ')))))) {
          bVar6 = *(char *)((long)buff + end) != '\t';
        }
        if (!bVar6) break;
        end = end + 1;
      }
      *(undefined8 *)(*(long *)((long)pvVar1 + 0x40) + 0x158) = 0;
      archive_strncat((archive_string *)(*(long *)((long)pvVar1 + 0x40) + 0x150),
                      (void *)((long)buff + local_70),end - local_70);
    }
    if (*(int *)(*(long *)((long)pvVar1 + 0x40) + 0xf8) == 0) {
      iVar4 = write_to_temp(a,buff,rsize);
      if (iVar4 != 0) {
        return -0x1e;
      }
      *(size_t *)(*(long *)((long)pvVar1 + 0x40) + 0xe8) =
           rsize + *(long *)(*(long *)((long)pvVar1 + 0x40) + 0xe8);
    }
    *(long *)((long)pvVar1 + 0x48) = *(long *)((long)pvVar1 + 0x48) - (long)pxStack_48;
    a_local = (archive_write *)pxStack_48;
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
xar_write_data(struct archive_write *a, const void *buff, size_t s)
{
	struct xar *xar;
	enum la_zaction run;
	size_t size = 0;
	size_t rsize;
	int r;

	xar = (struct xar *)a->format_data;

	if (s > xar->bytes_remaining)
		s = (size_t)xar->bytes_remaining;
	if (s == 0 || xar->cur_file == NULL)
		return (0);
	if (xar->cur_file->data.compression == NONE) {
		checksum_update(&(xar->e_sumwrk), buff, s);
		checksum_update(&(xar->a_sumwrk), buff, s);
		size = rsize = s;
	} else {
		xar->stream.next_in = (const unsigned char *)buff;
		xar->stream.avail_in = s;
		if (xar->bytes_remaining > s)
			run = ARCHIVE_Z_RUN;
		else
			run = ARCHIVE_Z_FINISH;
		/* Compress file data. */
		for (;;) {
			r = compression_code(&(a->archive), &(xar->stream),
			    run);
			if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
				return (ARCHIVE_FATAL);
			if (xar->stream.avail_out == 0 ||
			    run == ARCHIVE_Z_FINISH) {
				size = sizeof(xar->wbuff) -
				    xar->stream.avail_out;
				checksum_update(&(xar->a_sumwrk), xar->wbuff,
				    size);
				xar->cur_file->data.length += size;
				if (write_to_temp(a, xar->wbuff,
				    size) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				if (r == ARCHIVE_OK) {
					/* Output buffer was full */
					xar->stream.next_out = xar->wbuff;
					xar->stream.avail_out =
					    sizeof(xar->wbuff);
				} else {
					/* ARCHIVE_EOF - We are done */
					break;
				}
			} else {
				/* Compressor wants more input */
				break;
			}
		}
		rsize = s - xar->stream.avail_in;
		checksum_update(&(xar->e_sumwrk), buff, rsize);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	if (xar->bytes_remaining ==
	    (uint64_t)archive_entry_size(xar->cur_file->entry)) {
		/*
		 * Get the path of a shell script if so.
		 */
		const unsigned char *b = (const unsigned char *)buff;

		archive_string_empty(&(xar->cur_file->script));
		if (rsize > 2 && b[0] == '#' && b[1] == '!') {
			size_t i, end, off;

			off = 2;
			if (b[off] == ' ')
				off++;
#ifdef PATH_MAX
			if ((rsize - off) > PATH_MAX)
				end = off + PATH_MAX;
			else
#endif
				end = rsize;
			/* Find the end of a script path. */
			for (i = off; i < end && b[i] != '\0' &&
			    b[i] != '\n' && b[i] != '\r' &&
			    b[i] != ' ' && b[i] != '\t'; i++)
				;
			archive_strncpy(&(xar->cur_file->script), b + off,
			    i - off);
		}
	}
#endif

	if (xar->cur_file->data.compression == NONE) {
		if (write_to_temp(a, buff, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xar->cur_file->data.length += size;
	}
	xar->bytes_remaining -= rsize;

	return (rsize);
}